

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool __thiscall
CConnman::BindListenPort
          (CConnman *this,CService *addrBind,bilingual_str *strError,NetPermissionFlags permissions)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  sa_family_t sVar4;
  int iVar5;
  int *piVar6;
  Logger *pLVar7;
  undefined4 in_register_0000000c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  char *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  undefined1 local_210 [12];
  socklen_t len;
  int nOne;
  NetPermissionFlags permissions_local;
  string local_1f8;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  long *local_198;
  long local_190;
  long local_188 [2];
  undefined1 local_178 [32];
  _Alloc_hider local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  long *local_138 [2];
  long local_128 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  bilingual_str local_f8;
  sockaddr_storage sockaddr;
  
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(in_register_0000000c,permissions);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nOne = 1;
  len = 0x80;
  permissions_local = permissions;
  bVar3 = CService::GetSockAddr(addrBind,(sockaddr *)&sockaddr,&len);
  if (!bVar3) {
    local_158._M_p = (pointer)&local_148;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"Bind address family for %s not supported","");
    local_138[0] = local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_138,local_158._M_p,local_158._M_p + local_150);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,local_158._M_p,local_158._M_p + local_150);
    CService::ToStringAddrPort_abi_cxx11_((string *)local_178,addrBind);
    tinyformat::format<std::__cxx11::string>
              (&local_f8,(tinyformat *)local_138,(bilingual_str *)local_178,pbVar8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&strError->original,&local_f8.original);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&strError->translated,&local_f8.translated);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.translated._M_dataplus._M_p != &local_f8.translated.field_2) {
      operator_delete(local_f8.translated._M_dataplus._M_p,
                      local_f8.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.original._M_dataplus._M_p != &local_f8.original.field_2) {
      operator_delete(local_f8.original._M_dataplus._M_p,
                      local_f8.original.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (local_138[0] != local_128) {
      operator_delete(local_138[0],local_128[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_p != &local_148) {
      operator_delete(local_158._M_p,local_148._M_allocated_capacity + 1);
    }
    pLVar7 = LogInstance();
    bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar7,NET,Error);
    if (bVar3) {
      logging_function_00._M_str = "BindListenPort";
      logging_function_00._M_len = 0xe;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file_00._M_len = 0x50;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function_00,source_file_00,0xbec,NET,Error,"%s\n",&strError->original);
    }
    bVar3 = false;
    goto LAB_001add50;
  }
  sVar4 = CService::GetSAFamily(addrBind);
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  std::function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)>::operator()
            ((function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)> *)
             local_210,0xb39640,(uint)sVar4,1);
  if ((long *)local_210._0_8_ == (long *)0x0) {
    local_198 = local_188;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_198,
               "Couldn\'t open socket for incoming connections (socket returned error %s)","");
    local_138[0] = local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_138,local_198,local_190 + (long)local_198);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,local_198,local_190 + (long)local_198);
    piVar6 = __errno_location();
    NetworkErrorString_abi_cxx11_((string *)local_178,*piVar6);
    tinyformat::format<std::__cxx11::string>
              (&local_f8,(tinyformat *)local_138,(bilingual_str *)local_178,pbVar8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&strError->original,&local_f8.original);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&strError->translated,&local_f8.translated);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.translated._M_dataplus._M_p != &local_f8.translated.field_2) {
      operator_delete(local_f8.translated._M_dataplus._M_p,
                      local_f8.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.original._M_dataplus._M_p != &local_f8.original.field_2) {
      operator_delete(local_f8.original._M_dataplus._M_p,
                      local_f8.original.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (local_138[0] != local_128) {
      operator_delete(local_138[0],local_128[0] + 1);
    }
    if (local_198 != local_188) {
      operator_delete(local_198,local_188[0] + 1);
    }
    pLVar7 = LogInstance();
    bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar7,NET,Error);
    iVar5 = 0xbf3;
LAB_001ae6f1:
    if (bVar3 != false) {
      logging_function_03._M_str = "BindListenPort";
      logging_function_03._M_len = 0xe;
      source_file_03._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file_03._M_len = 0x50;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function_03,source_file_03,iVar5,NET,Error,"%s\n",&strError->original);
    }
LAB_001ae95e:
    bVar3 = false;
  }
  else {
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nOne;
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
    iVar5 = (**(code **)(*(long *)local_210._0_8_ + 0x50))(local_210._0_8_,1,2);
    if (iVar5 == -1) {
      local_1b8 = local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b8,"Error setting SO_REUSEADDR on socket: %s, continuing anyway",
                 "");
      local_138[0] = local_128;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_138,local_1b8,local_1b0 + (long)local_1b8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,local_1b8,local_1b0 + (long)local_1b8);
      piVar6 = __errno_location();
      NetworkErrorString_abi_cxx11_((string *)local_178,*piVar6);
      tinyformat::format<std::__cxx11::string>
                (&local_f8,(tinyformat *)local_138,(bilingual_str *)local_178,pbVar8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&strError->original,&local_f8.original);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&strError->translated,&local_f8.translated);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.translated._M_dataplus._M_p != &local_f8.translated.field_2) {
        operator_delete(local_f8.translated._M_dataplus._M_p,
                        local_f8.translated.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.original._M_dataplus._M_p != &local_f8.original.field_2) {
        operator_delete(local_f8.original._M_dataplus._M_p,
                        local_f8.original.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
        operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (local_138[0] != local_128) {
        operator_delete(local_138[0],local_128[0] + 1);
      }
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xbfb;
      logging_function_01._M_str = "BindListenPort";
      logging_function_01._M_len = 0xe;
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file_01._M_len = 0x50;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function_01,source_file_01,0xbfb,ALL,Info,"%s\n",&strError->original);
    }
    if ((addrBind->super_CNetAddr).m_net == NET_IPV6) {
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nOne;
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
      iVar5 = (**(code **)(*(long *)local_210._0_8_ + 0x50))(local_210._0_8_,0x29,0x1a);
      if (iVar5 == -1) {
        local_1d8 = local_1c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,"Error setting IPV6_V6ONLY on socket: %s, continuing anyway"
                   ,"");
        local_138[0] = local_128;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_138,local_1d8,local_1d0 + (long)local_1d8);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,local_1d8,local_1d0 + (long)local_1d8);
        piVar6 = __errno_location();
        NetworkErrorString_abi_cxx11_((string *)local_178,*piVar6);
        tinyformat::format<std::__cxx11::string>
                  (&local_f8,(tinyformat *)local_138,(bilingual_str *)local_178,pbVar8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&strError->original,&local_f8.original);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&strError->translated,&local_f8.translated);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.translated._M_dataplus._M_p != &local_f8.translated.field_2) {
          operator_delete(local_f8.translated._M_dataplus._M_p,
                          local_f8.translated.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.original._M_dataplus._M_p != &local_f8.original.field_2) {
          operator_delete(local_f8.original._M_dataplus._M_p,
                          local_f8.original.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
          operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if (local_138[0] != local_128) {
          operator_delete(local_138[0],local_128[0] + 1);
        }
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,local_1c8[0] + 1);
        }
        args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc04;
        logging_function_02._M_str = "BindListenPort";
        logging_function_02._M_len = 0xe;
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        source_file_02._M_len = 0x50;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function_02,source_file_02,0xc04,ALL,Info,"%s\n",&strError->original);
      }
    }
    iVar5 = (**(code **)(*(long *)local_210._0_8_ + 0x30))(local_210._0_8_,&sockaddr,len);
    if (iVar5 == -1) {
      piVar6 = __errno_location();
      iVar5 = *piVar6;
      local_138[0] = local_128;
      if (iVar5 == 0x62) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_138,
                   "Unable to bind to %s on this computer. %s is probably already running.","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,
                     "Unable to bind to %s on this computer. %s is probably already running.","");
        }
        else {
          local_178._0_8_ = "Unable to bind to %s on this computer. %s is probably already running."
          ;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_118,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_178);
        }
        CService::ToStringAddrPort_abi_cxx11_((string *)local_178,addrBind);
        tinyformat::format<std::__cxx11::string,char[13]>
                  (&local_f8,(tinyformat *)local_138,(bilingual_str *)local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Bitcoin Core",(char (*) [13])args_1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&strError->original,&local_f8.original);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&strError->translated,&local_f8.translated);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.translated._M_dataplus._M_p != &local_f8.translated.field_2) {
          operator_delete(local_f8.translated._M_dataplus._M_p,
                          local_f8.translated.field_2._M_allocated_capacity + 1);
        }
        local_1f8.field_2._M_allocated_capacity = local_f8.original.field_2._M_allocated_capacity;
        local_1f8._M_dataplus._M_p = local_f8.original._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.original._M_dataplus._M_p != &local_f8.original.field_2) {
LAB_001ae8a0:
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_138,
                   "Unable to bind to %s on this computer (bind returned error %s)","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,
                     "Unable to bind to %s on this computer (bind returned error %s)","");
        }
        else {
          local_178._0_8_ = "Unable to bind to %s on this computer (bind returned error %s)";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_118,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_178);
        }
        CService::ToStringAddrPort_abi_cxx11_((string *)local_178,addrBind);
        NetworkErrorString_abi_cxx11_(&local_1f8,iVar5);
        tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                  (&local_f8,(tinyformat *)local_138,(bilingual_str *)local_178,&local_1f8,args_1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&strError->original,&local_f8.original);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&strError->translated,&local_f8.translated);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.translated._M_dataplus._M_p != &local_f8.translated.field_2) {
          operator_delete(local_f8.translated._M_dataplus._M_p,
                          local_f8.translated.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.original._M_dataplus._M_p != &local_f8.original.field_2) {
          operator_delete(local_f8.original._M_dataplus._M_p,
                          local_f8.original.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) goto LAB_001ae8a0;
      }
      if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
        operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (local_138[0] != local_128) {
        operator_delete(local_138[0],local_128[0] + 1);
      }
      pLVar7 = LogInstance();
      bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar7,NET,Error);
      if (bVar3) {
        logging_function_04._M_str = "BindListenPort";
        logging_function_04._M_len = 0xe;
        source_file_04._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        source_file_04._M_len = 0x50;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function_04,source_file_04,0xc16,NET,Error,"%s\n",&strError->original);
      }
      goto LAB_001ae95e;
    }
    CService::ToStringAddrPort_abi_cxx11_(&local_f8.original,addrBind);
    logging_function._M_str = "BindListenPort";
    logging_function._M_len = 0xe;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    source_file._M_len = 0x50;
    args = "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    ::LogPrintf_<std::__cxx11::string>
              (logging_function,source_file,0xc19,ALL,Info,"Bound to %s\n",&local_f8.original);
    paVar2 = &local_f8.original.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.original._M_dataplus._M_p != paVar2) {
      operator_delete(local_f8.original._M_dataplus._M_p,
                      local_f8.original.field_2._M_allocated_capacity + 1);
    }
    iVar5 = (**(code **)(*(long *)local_210._0_8_ + 0x38))(local_210._0_8_,0x1000);
    if (iVar5 == -1) {
      local_138[0] = local_128;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_138,
                 "Listening for incoming connections failed (listen returned error %s)","");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,
                   "Listening for incoming connections failed (listen returned error %s)","");
      }
      else {
        local_178._0_8_ = "Listening for incoming connections failed (listen returned error %s)";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_118,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_178);
      }
      piVar6 = __errno_location();
      NetworkErrorString_abi_cxx11_((string *)local_178,*piVar6);
      tinyformat::format<std::__cxx11::string>
                (&local_f8,(tinyformat *)local_138,(bilingual_str *)local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&strError->original,&local_f8.original);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&strError->translated,&local_f8.translated);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.translated._M_dataplus._M_p != &local_f8.translated.field_2) {
        operator_delete(local_f8.translated._M_dataplus._M_p,
                        local_f8.translated.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.original._M_dataplus._M_p != paVar2) {
        operator_delete(local_f8.original._M_dataplus._M_p,
                        local_f8.original.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
        operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (local_138[0] != local_128) {
        operator_delete(local_138[0],local_128[0] + 1);
      }
      pLVar7 = LogInstance();
      bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar7,NET,Error);
      iVar5 = 0xc1f;
      goto LAB_001ae6f1;
    }
    bVar3 = true;
    std::vector<CConnman::ListenSocket,std::allocator<CConnman::ListenSocket>>::
    emplace_back<std::unique_ptr<Sock,std::default_delete<Sock>>,NetPermissionFlags&>
              ((vector<CConnman::ListenSocket,std::allocator<CConnman::ListenSocket>> *)
               &this->vhListenSocket,(unique_ptr<Sock,_std::default_delete<Sock>_> *)local_210,
               &permissions_local);
  }
  if ((long *)local_210._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_210._0_8_ + 8))();
  }
LAB_001add50:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool CConnman::BindListenPort(const CService& addrBind, bilingual_str& strError, NetPermissionFlags permissions)
{
    int nOne = 1;

    // Create socket for listening for incoming connections
    struct sockaddr_storage sockaddr;
    socklen_t len = sizeof(sockaddr);
    if (!addrBind.GetSockAddr((struct sockaddr*)&sockaddr, &len))
    {
        strError = strprintf(Untranslated("Bind address family for %s not supported"), addrBind.ToStringAddrPort());
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "%s\n", strError.original);
        return false;
    }

    std::unique_ptr<Sock> sock = CreateSock(addrBind.GetSAFamily(), SOCK_STREAM, IPPROTO_TCP);
    if (!sock) {
        strError = strprintf(Untranslated("Couldn't open socket for incoming connections (socket returned error %s)"), NetworkErrorString(WSAGetLastError()));
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "%s\n", strError.original);
        return false;
    }

    // Allow binding if the port is still in TIME_WAIT state after
    // the program was closed and restarted.
    if (sock->SetSockOpt(SOL_SOCKET, SO_REUSEADDR, (sockopt_arg_type)&nOne, sizeof(int)) == SOCKET_ERROR) {
        strError = strprintf(Untranslated("Error setting SO_REUSEADDR on socket: %s, continuing anyway"), NetworkErrorString(WSAGetLastError()));
        LogPrintf("%s\n", strError.original);
    }

    // some systems don't have IPV6_V6ONLY but are always v6only; others do have the option
    // and enable it by default or not. Try to enable it, if possible.
    if (addrBind.IsIPv6()) {
#ifdef IPV6_V6ONLY
        if (sock->SetSockOpt(IPPROTO_IPV6, IPV6_V6ONLY, (sockopt_arg_type)&nOne, sizeof(int)) == SOCKET_ERROR) {
            strError = strprintf(Untranslated("Error setting IPV6_V6ONLY on socket: %s, continuing anyway"), NetworkErrorString(WSAGetLastError()));
            LogPrintf("%s\n", strError.original);
        }
#endif
#ifdef WIN32
        int nProtLevel = PROTECTION_LEVEL_UNRESTRICTED;
        if (sock->SetSockOpt(IPPROTO_IPV6, IPV6_PROTECTION_LEVEL, (const char*)&nProtLevel, sizeof(int)) == SOCKET_ERROR) {
            strError = strprintf(Untranslated("Error setting IPV6_PROTECTION_LEVEL on socket: %s, continuing anyway"), NetworkErrorString(WSAGetLastError()));
            LogPrintf("%s\n", strError.original);
        }
#endif
    }

    if (sock->Bind(reinterpret_cast<struct sockaddr*>(&sockaddr), len) == SOCKET_ERROR) {
        int nErr = WSAGetLastError();
        if (nErr == WSAEADDRINUSE)
            strError = strprintf(_("Unable to bind to %s on this computer. %s is probably already running."), addrBind.ToStringAddrPort(), PACKAGE_NAME);
        else
            strError = strprintf(_("Unable to bind to %s on this computer (bind returned error %s)"), addrBind.ToStringAddrPort(), NetworkErrorString(nErr));
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "%s\n", strError.original);
        return false;
    }
    LogPrintf("Bound to %s\n", addrBind.ToStringAddrPort());

    // Listen for incoming connections
    if (sock->Listen(SOMAXCONN) == SOCKET_ERROR)
    {
        strError = strprintf(_("Listening for incoming connections failed (listen returned error %s)"), NetworkErrorString(WSAGetLastError()));
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "%s\n", strError.original);
        return false;
    }

    vhListenSocket.emplace_back(std::move(sock), permissions);
    return true;
}